

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow *window,int n)

{
  ImGuiID IVar1;
  ImU32 local_20;
  bool local_19;
  int local_14;
  ImGuiID id;
  int n_local;
  ImGuiWindow *window_local;
  
  local_19 = 3 < (uint)n;
  local_14 = n;
  _id = window;
  if (local_19) {
    __assert_fail("n >= 0 && n < 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1642,"ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow *, int)");
  }
  if ((window->field_0x3e1 & 1) == 0) {
    local_20 = window->ID;
  }
  else {
    local_20 = window->DockNode->HostWindow->ID;
  }
  IVar1 = ImHashStr("#RESIZE",0,local_20);
  IVar1 = ImHashData(&local_14,4,IVar1);
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow* window, int n)
{
    IM_ASSERT(n >= 0 && n < 4);
    ImGuiID id = window->DockIsActive ? window->DockNode->HostWindow->ID : window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}